

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O0

NgramBuilder NgramBuilder_init(size_t *gram_nums,uint32_t order)

{
  NgramBuilder pNVar1;
  HashVocab pHVar2;
  size_t *psVar3;
  char *pcVar4;
  char **ppcVar5;
  uint local_28;
  uint local_24;
  uint32_t i;
  uint32_t total_num;
  NgramBuilder builder;
  uint32_t order_local;
  size_t *gram_nums_local;
  
  if (order != 0) {
    pNVar1 = (NgramBuilder)malloc(0x48);
    pHVar2 = HashVocab_init(*gram_nums);
    pNVar1->vocab = pHVar2;
    psVar3 = (size_t *)malloc((ulong)order << 3);
    pNVar1->gram_nums = psVar3;
    psVar3 = (size_t *)malloc((ulong)order << 3);
    pNVar1->added_gram_nums = psVar3;
    local_24 = 0;
    for (local_28 = 0; local_28 < order; local_28 = local_28 + 1) {
      pNVar1->gram_nums[local_28] = gram_nums[local_28];
      pNVar1->added_gram_nums[local_28] = 0;
      local_24 = local_24 + (int)gram_nums[local_28];
    }
    pNVar1->cache_size = (ulong)local_24 * 0x18;
    pNVar1->used_cache_size = 0;
    pcVar4 = (char *)malloc(pNVar1->cache_size);
    pNVar1->ngram_cache = pcVar4;
    ppcVar5 = (char **)malloc((ulong)local_24 << 3);
    pNVar1->ngram_offsets = ppcVar5;
    pNVar1->added_total_gram_num = 0;
    pNVar1->order = order;
    return pNVar1;
  }
  __assert_fail("order > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c",
                0x135,"NgramBuilder NgramBuilder_init(const size_t *, uint32_t)");
}

Assistant:

NgramBuilder NgramBuilder_init(const size_t* gram_nums, uint32_t order){
    assert(order > 0);
    NgramBuilder builder = malloc(sizeof(struct NgramBuilder_T));
    builder->vocab = HashVocab_init(gram_nums[0]);
    builder->gram_nums = malloc(order*sizeof(size_t));
    builder->added_gram_nums = malloc(order*sizeof(size_t));
    uint32_t total_num = 0;
    for (uint32_t i = 0;i< order;i++) {
        builder->gram_nums[i] = gram_nums[i];
        builder->added_gram_nums[i] = 0;
        total_num += gram_nums[i];
    }

    builder->cache_size = avg_ngram_len*total_num;
    builder->used_cache_size = 0;
    builder->ngram_cache = malloc(builder->cache_size);

    builder->ngram_offsets = malloc(total_num * sizeof(char*));
    builder->added_total_gram_num = 0;
    builder->order = order;
    return builder;
}